

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c2mir.c
# Opt level: O0

op_t * force_reg_or_mem(op_t *__return_storage_ptr__,c2m_ctx_t c2m_ctx,op_t op,MIR_type_t t)

{
  op_t op_00;
  undefined1 auVar1 [64];
  MIR_type_t t_local;
  c2m_ctx_t c2m_ctx_local;
  
  if (((op.mir_op._8_2_ & 0xff) == 1) || ((op.mir_op._8_2_ & 0xff) == 10)) {
    memcpy(__return_storage_ptr__,&op,0x40);
  }
  else {
    if (((op.mir_op._8_2_ & 0xff) != 8) && ((op.mir_op._8_2_ & 0xff) != 9)) {
      __assert_fail("op.mir_op.mode == MIR_OP_REF || op.mir_op.mode == MIR_OP_STR",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/c2mir/c2mir.c"
                    ,0x2ae7,"op_t force_reg_or_mem(c2m_ctx_t, op_t, MIR_type_t)");
    }
    auVar1 = vmovdqu64_avx512f((undefined1  [64])op);
    op_00 = (op_t)vmovdqu64_avx512f(auVar1);
    force_reg(__return_storage_ptr__,c2m_ctx,op_00,t);
  }
  return __return_storage_ptr__;
}

Assistant:

static op_t force_reg_or_mem (c2m_ctx_t c2m_ctx, op_t op, MIR_type_t t) {
  if (op.mir_op.mode == MIR_OP_REG || op.mir_op.mode == MIR_OP_MEM) return op;
  assert (op.mir_op.mode == MIR_OP_REF || op.mir_op.mode == MIR_OP_STR);
  return force_reg (c2m_ctx, op, t);
}